

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glloader.c
# Opt level: O0

ktx_error_code_e
compressedTexImage3DCallback
          (int miplevel,int face,int width,int height,int depth,ktx_uint64_t faceLodSize,
          void *pixels,void *userdata)

{
  GLenum GVar1;
  GLsizei in_ECX;
  GLsizei in_EDX;
  int in_ESI;
  GLint in_EDI;
  GLsizei in_R8D;
  ulong in_R9;
  void *in_stack_00000008;
  int *in_stack_00000010;
  ktx_cbdata *cbData;
  GLsizei local_54;
  ktx_error_code_e local_c;
  
  if (in_R9 < 0x100000000) {
    if (gl.glCompressedTexImage3D == (PFNGLCOMPRESSEDTEXIMAGE3DPROC)0x0) {
      __assert_fail("gl.glCompressedTexImage3D != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/glloader.c"
                    ,0x277,
                    "ktx_error_code_e compressedTexImage3DCallback(int, int, int, int, int, ktx_uint64_t, void *, void *)"
                   );
    }
    local_54 = in_R8D;
    if (in_stack_00000010[5] != 0) {
      local_54 = in_stack_00000010[5];
    }
    (*gl.glCompressedTexImage3D)
              (*in_stack_00000010 + in_ESI,in_EDI,in_stack_00000010[2],in_EDX,in_ECX,local_54,0,
               (GLsizei)in_R9,in_stack_00000008);
    GVar1 = (*gl.glGetError)();
    in_stack_00000010[4] = GVar1;
    if (GVar1 == 0) {
      local_c = KTX_SUCCESS;
    }
    else {
      local_c = KTX_GL_ERROR;
    }
  }
  else {
    local_c = KTX_INVALID_OPERATION;
  }
  return local_c;
}

Assistant:

KTX_error_code
compressedTexImage3DCallback(int miplevel, int face,
                             int width, int height,
                             int depth,
                             ktx_uint64_t faceLodSize,
                             void* pixels, void* userdata)
{
    ktx_cbdata* cbData = (ktx_cbdata*)userdata;

    if (faceLodSize > UINT32_MAX)
        return KTX_INVALID_OPERATION; // Too big for OpenGL {,ES}.

    assert(gl.glCompressedTexImage3D != NULL);
    gl.glCompressedTexImage3D(cbData->glTarget + face, miplevel,
                             cbData->glInternalformat,
                             width, height,
                             cbData->numLayers == 0 ? (GLuint)depth : cbData->numLayers,
                             0,
                             (ktx_uint32_t)faceLodSize, pixels);

    if ((cbData->glError = glGetError()) == GL_NO_ERROR) {
        return KTX_SUCCESS;
    } else {
        return KTX_GL_ERROR;
    }
}